

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

us_internal_ssl_socket_t *
ssl_on_open(us_internal_ssl_socket_t *s,int is_client,char *ip,int ip_length)

{
  void *pvVar1;
  us_socket_context_t *context;
  us_loop_t *puVar2;
  SSL *s_00;
  us_internal_ssl_socket_t *puVar3;
  
  context = us_socket_context(0,&s->s);
  puVar2 = us_socket_context_loop(0,context);
  pvVar1 = (puVar2->data).ssl_data;
  s_00 = SSL_new((SSL_CTX *)context[1].loop);
  s->ssl = (SSL *)s_00;
  s->ssl_write_wants_read = 0;
  SSL_set_bio(s_00,*(BIO **)((long)pvVar1 + 0x38),*(BIO **)((long)pvVar1 + 0x40));
  BIO_up_ref(*(undefined8 *)((long)pvVar1 + 0x38));
  BIO_up_ref(*(undefined8 *)((long)pvVar1 + 0x40));
  if (is_client == 0) {
    SSL_set_accept_state((SSL *)s->ssl);
  }
  else {
    SSL_set_connect_state((SSL *)s->ssl);
  }
  puVar3 = (us_internal_ssl_socket_t *)(*(code *)context[1].iterator)(s,is_client,ip,ip_length);
  return puVar3;
}

Assistant:

struct us_internal_ssl_socket_t *ssl_on_open(struct us_internal_ssl_socket_t *s, int is_client, char *ip, int ip_length) {
    struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

    struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

    s->ssl = SSL_new(context->ssl_context);
    s->ssl_write_wants_read = 0;
    SSL_set_bio(s->ssl, loop_ssl_data->shared_rbio, loop_ssl_data->shared_wbio);

    BIO_up_ref(loop_ssl_data->shared_rbio);
    BIO_up_ref(loop_ssl_data->shared_wbio);

    if (is_client) {
        SSL_set_connect_state(s->ssl);
    } else {
        SSL_set_accept_state(s->ssl);
    }

    return (struct us_internal_ssl_socket_t *) context->on_open(s, is_client, ip, ip_length);
}